

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O3

span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> * __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
          (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this)

{
  long lVar1;
  
  if (((this->span_ != (span<unsigned_char,__1L> *)0x0) && (lVar1 = this->index_, -1 < lVar1)) &&
     (lVar1 < (this->span_->storage_).super_extent_type<_1L>.size_)) {
    this->index_ = lVar1 + 1;
    return this;
  }
  assert_failed("span_ && index_ >= 0 && index_ < span_->length ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x79);
}

Assistant:

span_iterator & operator++ () noexcept {
                    PSTORE_ASSERT (span_ && index_ >= 0 && index_ < span_->length ());
                    ++index_;
                    return *this;
                }